

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

int Nwk_ManVerifyTopoOrder(Nwk_Man_t *pNtk)

{
  long *plVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  long lVar8;
  char *__format;
  long lVar9;
  
  Nwk_ManIncrementTravId(pNtk);
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      plVar1 = (long *)pVVar6->pArray[lVar9];
      if (plVar1 != (long *)0x0) {
        uVar3 = *(uint *)(plVar1 + 4) & 7;
        if (uVar3 - 2 < 2) {
          if (0 < (long)*(int *)((long)plVar1 + 0x3c)) {
            lVar8 = 0;
            do {
              plVar2 = *(long **)(plVar1[9] + lVar8 * 8);
              if (plVar2 == (long *)0x0) break;
              if ((int)plVar2[5] != *(int *)(*plVar2 + 0x68)) {
                uVar3 = *(uint *)((long)plVar1 + 0x24);
                uVar5 = *(uint *)((long)plVar2 + 0x24);
                __format = "Node %d has fanin %d that is not in a topological order.\n";
LAB_008ca92a:
                printf(__format,(ulong)uVar3,(ulong)uVar5);
                return 0;
              }
              lVar8 = lVar8 + 1;
            } while (*(int *)((long)plVar1 + 0x3c) != lVar8);
          }
        }
        else {
          if (uVar3 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                          ,0x55,"int Nwk_ManVerifyTopoOrder(Nwk_Man_t *)");
          }
          if ((pNtk->pManTime != (Tim_Man_t *)0x0) &&
             (uVar3 = Tim_ManBoxForCi(pNtk->pManTime,*(uint *)(plVar1 + 4) >> 7), -1 < (int)uVar3))
          {
            iVar4 = Tim_ManBoxInputFirst(pNtk->pManTime,uVar3);
            uVar5 = Tim_ManBoxInputNum(pNtk->pManTime,uVar3);
            if (0 < (int)uVar5) {
              lVar8 = (long)iVar4;
              uVar7 = (ulong)uVar5;
              do {
                if ((iVar4 < 0) || (pNtk->vCos->nSize <= lVar8)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                plVar2 = (long *)pNtk->vCos->pArray[lVar8];
                if ((int)plVar2[5] != *(int *)(*plVar2 + 0x68)) {
                  uVar5 = *(uint *)((long)plVar2 + 0x24);
                  __format = "Box %d has input %d that is not in a topological order.\n";
                  goto LAB_008ca92a;
                }
                lVar8 = lVar8 + 1;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
          }
        }
        *(undefined4 *)(plVar1 + 5) = *(undefined4 *)(*plVar1 + 0x68);
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Nwk_ManVerifyTopoOrder( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Nwk_ManIncrementTravId( pNtk );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
        {
            Nwk_ObjForEachFanin( pObj, pNext, k )
            {
                if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                {
                    printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                    return 0;
                }
            }
        }
        else if ( Nwk_ObjIsCi(pObj) )
        {
            if ( pNtk->pManTime )
            {
                iBox = Tim_ManBoxForCi( pNtk->pManTime, pObj->PioId );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( pNtk->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pNtk->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo( pNtk, iTerm1 + k );
                        if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else
            assert( 0 );
        Nwk_ObjSetTravIdCurrent( pObj );
    }
    return 1;
}